

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTreeTest.cc
# Opt level: O2

void run_basic_test(void)

{
  size_t sVar1;
  bool bVar2;
  __normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_> __first;
  long *plVar3;
  size_type sVar4;
  __normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_> __last;
  KDTree<phosg::Vector2<long>,_long> *__range1;
  pair<phosg::Vector2<long>,_long> *it;
  _Map_pointer pppNVar5;
  KDTree<phosg::Vector2<long>,_long> t;
  set<Entry,_std::less<Entry>,_std::allocator<Entry>_> remaining_entries_1;
  set<Entry,_std::less<Entry>,_std::allocator<Entry>_> remaining_entries;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_380;
  anon_union_8_2_94730038_for_Vector2<long>_3 aStack_378;
  _Elt_pointer local_370;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_368;
  anon_union_8_2_94730038_for_Vector2<long>_3 aStack_360;
  vector<Entry,_std::allocator<Entry>_> entries;
  Iterator __end1;
  _Any_data local_2c0;
  code *local_2b0;
  code *local_2a8;
  Iterator local_2a0;
  Iterator local_238;
  Iterator local_1d0;
  Iterator local_168;
  Iterator local_100;
  Iterator local_98;
  
  puts("-- basic");
  puts("--   construction");
  t.root = (Node *)0x0;
  t.node_count = 0;
  phosg::expect_generic
            (true,"t.size() != 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x5e);
  entries.super__Vector_base<Entry,_std::allocator<Entry>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  entries.super__Vector_base<Entry,_std::allocator<Entry>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  entries.super__Vector_base<Entry,_std::allocator<Entry>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __first._M_current = (Entry *)operator_new(0x90);
  __last._M_current = __first._M_current + 6;
  entries.super__Vector_base<Entry,_std::allocator<Entry>_>._M_impl.super__Vector_impl_data._M_start
       = __first._M_current;
  entries.super__Vector_base<Entry,_std::allocator<Entry>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __last._M_current;
  memcpy(__first._M_current,&DAT_001185e0,0x90);
  entries.super__Vector_base<Entry,_std::allocator<Entry>_>._M_impl.super__Vector_impl_data.
  _M_finish = __last._M_current;
  puts("--   insert");
  remaining_entries._M_t._M_impl._0_8_ = 2;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 3;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_98,&t,(Vector2<long> *)&remaining_entries,(long *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_98);
  remaining_entries._M_t._M_impl._0_8_ = 5;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 4;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x1;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_100,&t,(Vector2<long> *)&remaining_entries,(long *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_100);
  remaining_entries._M_t._M_impl._0_8_ = 9;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x2;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_168,&t,(Vector2<long> *)&remaining_entries,(long *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_168);
  remaining_entries._M_t._M_impl._0_8_ = 4;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 7;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x3;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_1d0,&t,(Vector2<long> *)&remaining_entries,(long *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_1d0);
  remaining_entries._M_t._M_impl._0_8_ = 8;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&DAT_00000004;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_238,&t,(Vector2<long> *)&remaining_entries,(long *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_238);
  remaining_entries._M_t._M_impl._0_8_ = 7;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x5;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_2a0,&t,(Vector2<long> *)&remaining_entries,(long *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&local_2a0);
  puts("--   at/exists");
  phosg::expect_generic
            (t.node_count == 6,"6 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x87);
  remaining_entries._M_t._M_impl._0_8_ = 8;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  plVar3 = phosg::KDTree<phosg::Vector2<long>,_long>::at(&t,(Vector2<long> *)&remaining_entries);
  phosg::expect_generic
            (*plVar3 == 4,"4 != t.at({8, 1})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x88);
  local_2c0._8_8_ = 0;
  local_2a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc:137:3)>
              ::_M_invoke;
  local_2b0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc:137:3)>
              ::_M_manager;
  local_2c0._M_unused._M_object = &t;
  phosg::expect_raises_fn<std::out_of_range>
            ("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x8b,(function<void_()> *)&local_2c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2c0);
  remaining_entries._M_t._M_impl._0_8_ = 5;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 4;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::exists(&t,(Vector2<long> *)&remaining_entries);
  phosg::expect_generic
            (bVar2,"true != t.exists({5, 4})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x8c);
  remaining_entries._M_t._M_impl._0_8_ = 5;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 3;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::exists(&t,(Vector2<long> *)&remaining_entries);
  phosg::expect_generic
            (!bVar2,"false != t.exists({5, 3})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x8d);
  puts("--   within");
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x2;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 3;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::insert
            (&remaining_entries,(value_type *)&__end1);
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&DAT_00000004;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 7;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x3;
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::insert
            (&remaining_entries,(value_type *)&__end1);
  remaining_entries_1._M_t._M_impl._0_8_ = 0;
  remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_368.x = 5;
  aStack_360.y = 10;
  phosg::KDTree<phosg::Vector2<long>,_long>::within
            ((vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
              *)&__end1,&t,(Vector2<long> *)&remaining_entries_1,(Vector2<long> *)&local_368);
  sVar1 = __end1.pending.
          super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
          ._M_impl.super__Deque_impl_data._M_map_size;
  for (pppNVar5 = __end1.pending.
                  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  ._M_impl.super__Deque_impl_data._M_map; pppNVar5 != (_Map_pointer)sVar1;
      pppNVar5 = pppNVar5 + 3) {
    remaining_entries_1._M_t._M_impl._0_8_ = *pppNVar5;
    remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pppNVar5[1];
    remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)pppNVar5[2];
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      (&remaining_entries,(key_type *)&remaining_entries_1);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x95);
  }
  std::
  _Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
                   *)&__end1);
  phosg::expect_generic
            (remaining_entries._M_t._M_impl.super__Rb_tree_header._M_node_count == 0,
             "0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x97);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  ~_Rb_tree(&remaining_entries._M_t);
  puts("--   erase");
  remaining_entries._M_t._M_impl._0_8_ = 8;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x2;
  bVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::erase
                    (&t,(Vector2<long> *)&remaining_entries,(long *)&__end1);
  phosg::expect_generic
            (!bVar2,"false != t.erase({8, 6}, 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9b);
  phosg::expect_generic
            (t.node_count == 6,"6 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9c);
  remaining_entries._M_t._M_impl._0_8_ = 9;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x1;
  bVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::erase
                    (&t,(Vector2<long> *)&remaining_entries,(long *)&__end1);
  phosg::expect_generic
            (!bVar2,"false != t.erase({9, 6}, 1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9d);
  phosg::expect_generic
            (t.node_count == 6,"6 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9e);
  remaining_entries._M_t._M_impl._0_8_ = 9;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x2;
  bVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::erase
                    (&t,(Vector2<long> *)&remaining_entries,(long *)&__end1);
  phosg::expect_generic
            (bVar2,"true != t.erase({9, 6}, 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9f);
  phosg::expect_generic
            (t.node_count == 5,"5 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xa0);
  puts("--   iterate");
  std::
  set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
  ::
  set<__gnu_cxx::__normal_iterator<run_basic_test()::Entry_const*,std::vector<run_basic_test()::Entry,std::allocator<run_basic_test()::Entry>>>>
            ((set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
              *)&remaining_entries_1,__first,__last);
  remaining_entries._M_t._M_impl._0_8_ = 9;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x2;
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    (&remaining_entries_1,(key_type *)&remaining_entries);
  phosg::expect_generic
            (sVar4 == 1,"1 != remaining_entries.erase({9, 6, 2})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xa5);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&remaining_entries,t.root);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator(&__end1,(Node *)0x0);
  while( true ) {
    bVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                      ((Iterator *)&remaining_entries,&__end1);
    if (!bVar2) break;
    local_368.x = local_380.x;
    aStack_360.y = aStack_378.y;
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      (&remaining_entries_1,(key_type *)&local_368);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xa7);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&remaining_entries);
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&remaining_entries);
  phosg::expect_generic
            (remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_node_count == 0,
             "0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xa9);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  ~_Rb_tree(&remaining_entries_1._M_t);
  puts("--   iterate+erase");
  std::
  set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
  ::
  set<__gnu_cxx::__normal_iterator<run_basic_test()::Entry_const*,std::vector<run_basic_test()::Entry,std::allocator<run_basic_test()::Entry>>>>
            ((set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
              *)&remaining_entries_1,__first,__last);
  remaining_entries._M_t._M_impl._0_8_ = 9;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x2;
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    (&remaining_entries_1,(key_type *)&remaining_entries);
  phosg::expect_generic
            (sVar4 == 1,"1 != remaining_entries.erase({9, 6, 2})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xaf);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&remaining_entries,t.root);
  while( true ) {
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator(&__end1,(Node *)0x0);
    bVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                      ((Iterator *)&remaining_entries,&__end1);
    std::
    _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                    *)&__end1);
    if (!bVar2) break;
    __end1.pending.
    super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)local_380;
    __end1.pending.
    super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ._M_impl.super__Deque_impl_data._M_map_size = aStack_378.y;
    __end1.pending.
    super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = local_370;
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      (&remaining_entries_1,(key_type *)&__end1);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it->first.x, it->first.y, it->second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xb1);
    if ((undefined1 *)local_380.x == &DAT_00000004) {
      phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance(&t,(Iterator *)&remaining_entries);
    }
    else {
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++
                ((Iterator *)&remaining_entries);
    }
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&remaining_entries);
  phosg::expect_generic
            (remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_node_count == 0,
             "0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xb8);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  ~_Rb_tree(&remaining_entries_1._M_t);
  puts("--   ensure committed (iterate)");
  std::
  set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
  ::
  set<__gnu_cxx::__normal_iterator<run_basic_test()::Entry_const*,std::vector<run_basic_test()::Entry,std::allocator<run_basic_test()::Entry>>>>
            ((set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
              *)&remaining_entries_1,__first,__last);
  remaining_entries._M_t._M_impl._0_8_ = 9;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x2;
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    (&remaining_entries_1,(key_type *)&remaining_entries);
  phosg::expect_generic
            (sVar4 == 1,"1 != remaining_entries.erase({9, 6, 2})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xbe);
  remaining_entries._M_t._M_impl._0_8_ = 4;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 7;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x3;
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    (&remaining_entries_1,(key_type *)&remaining_entries);
  phosg::expect_generic
            (sVar4 == 1,"1 != remaining_entries.erase({4, 7, 3})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xbf);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator
            ((Iterator *)&remaining_entries,t.root);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator(&__end1,(Node *)0x0);
  while( true ) {
    bVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                      ((Iterator *)&remaining_entries,&__end1);
    if (!bVar2) break;
    local_368.x = local_380.x;
    aStack_360.y = aStack_378.y;
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      (&remaining_entries_1,(key_type *)&local_368);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xc1);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)&remaining_entries);
  }
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&__end1);
  std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  *)&remaining_entries);
  phosg::expect_generic
            (remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_node_count == 0,
             "0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xc3);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  ~_Rb_tree(&remaining_entries_1._M_t);
  puts("--   ensure committed (within)");
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x2;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 3;
  __end1.pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       remaining_entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::insert
            (&remaining_entries,(value_type *)&__end1);
  remaining_entries_1._M_t._M_impl._0_8_ = 0;
  remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_368.x = 5;
  aStack_360.y = 10;
  phosg::KDTree<phosg::Vector2<long>,_long>::within
            ((vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
              *)&__end1,&t,(Vector2<long> *)&remaining_entries_1,(Vector2<long> *)&local_368);
  sVar1 = __end1.pending.
          super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
          ._M_impl.super__Deque_impl_data._M_map_size;
  for (pppNVar5 = __end1.pending.
                  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                  ._M_impl.super__Deque_impl_data._M_map; pppNVar5 != (_Map_pointer)sVar1;
      pppNVar5 = pppNVar5 + 3) {
    remaining_entries_1._M_t._M_impl._0_8_ = *pppNVar5;
    remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pppNVar5[1];
    remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)pppNVar5[2];
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      (&remaining_entries,(key_type *)&remaining_entries_1);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xcb);
  }
  std::
  _Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
                   *)&__end1);
  phosg::expect_generic
            (remaining_entries._M_t._M_impl.super__Rb_tree_header._M_node_count == 0,
             "0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xcd);
  std::_Rb_tree<Entry,_Entry,_std::_Identity<Entry>,_std::less<Entry>,_std::allocator<Entry>_>::
  ~_Rb_tree(&remaining_entries._M_t);
  std::_Vector_base<Entry,_std::allocator<Entry>_>::~_Vector_base
            (&entries.super__Vector_base<Entry,_std::allocator<Entry>_>);
  phosg::KDTree<phosg::Vector2<long>,_long>::~KDTree(&t);
  return;
}

Assistant:

void run_basic_test() {
  printf("-- basic\n");

  printf("--   construction\n");

  KDTree<Vector2<int64_t>, int64_t> t;
  expect_eq(t.size(), 0);

  struct Entry {
    int64_t x;
    int64_t y;
    int64_t v;

    bool operator<(const Entry& other) const {
      if (this->x < other.x) {
        return true;
      }
      if (this->x > other.x) {
        return false;
      }
      if (this->y < other.y) {
        return true;
      }
      if (this->y > other.y) {
        return false;
      }
      return (this->v < other.v);
    }
  };
  const vector<Entry> entries({
      {2, 3, 0},
      {5, 4, 1},
      {9, 6, 2},
      {4, 7, 3},
      {8, 1, 4},
      {7, 2, 5},
  });

  printf("--   insert\n");
  t.insert({2, 3}, 0);
  t.insert({5, 4}, 1);
  t.insert({9, 6}, 2);
  t.insert({4, 7}, 3);
  t.insert({8, 1}, 4);
  t.insert({7, 2}, 5);

  printf("--   at/exists\n");
  expect_eq(6, t.size());
  expect_eq(4, t.at({8, 1}));
  expect_raises(out_of_range, [&]() {
    t.at({8, 2});
  });
  expect_eq(true, t.exists({5, 4}));
  expect_eq(false, t.exists({5, 3}));

  printf("--   within\n");
  {
    set<Entry> remaining_entries;
    remaining_entries.insert({2, 3, 0});
    remaining_entries.insert({4, 7, 3});
    for (const auto& it : t.within({0, 0}, {5, 10})) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   erase\n");
  expect_eq(false, t.erase({8, 6}, 2));
  expect_eq(6, t.size());
  expect_eq(false, t.erase({9, 6}, 1));
  expect_eq(6, t.size());
  expect_eq(true, t.erase({9, 6}, 2));
  expect_eq(5, t.size());

  printf("--   iterate\n");
  {
    set<Entry> remaining_entries(entries.begin(), entries.end());
    expect_eq(1, remaining_entries.erase({9, 6, 2}));
    for (const auto& it : t) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   iterate+erase\n");
  {
    set<Entry> remaining_entries(entries.begin(), entries.end());
    expect_eq(1, remaining_entries.erase({9, 6, 2}));
    for (auto it = t.begin(); it != t.end();) {
      expect_eq(1, remaining_entries.erase({it->first.x, it->first.y, it->second}));
      if (it->first.x == 4) {
        t.erase_advance(it);
      } else {
        ++it;
      }
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   ensure committed (iterate)\n");
  {
    set<Entry> remaining_entries(entries.begin(), entries.end());
    expect_eq(1, remaining_entries.erase({9, 6, 2}));
    expect_eq(1, remaining_entries.erase({4, 7, 3}));
    for (const auto& it : t) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   ensure committed (within)\n");
  {
    set<Entry> remaining_entries;
    remaining_entries.insert({2, 3, 0});
    for (const auto& it : t.within({0, 0}, {5, 10})) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }
}